

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::InverseDynamics
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDot,VectorNd *Tau,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  uint uVar1;
  Scalar *pSVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference ppCVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  reference pvVar9;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_R8;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_R9;
  ReturnType RVar11;
  uint k_1;
  uint i_2;
  uint lambda_1;
  uint i_1;
  uint z;
  VectorNd customJointQDDot;
  uint k;
  VectorNd *in_stack_00000630;
  VectorNd *in_stack_00000638;
  uint in_stack_00000644;
  Model *in_stack_00000648;
  uint lambda;
  uint q_index;
  uint i;
  Index in_stack_fffffffffffff888;
  SpatialTransform *this;
  SpatialTransform *in_stack_fffffffffffff890;
  reference in_stack_fffffffffffff898;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff8a0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_fffffffffffff8a8;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8b0;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8b8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8c0;
  reference in_stack_fffffffffffff8c8;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8d0;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffff8d8;
  Vector3_t *in_stack_fffffffffffff8e0;
  double *in_stack_fffffffffffff8e8;
  double *in_stack_fffffffffffff8f0;
  double *in_stack_fffffffffffff8f8;
  double *in_stack_fffffffffffff900;
  double *in_stack_fffffffffffff908;
  SpatialVector_t *in_stack_fffffffffffff910;
  double *in_stack_fffffffffffff920;
  double dVar12;
  SpatialTransform *in_stack_fffffffffffff950;
  SpatialTransform *in_stack_fffffffffffff958;
  SpatialVector *in_stack_fffffffffffff9c0;
  SpatialVector *in_stack_fffffffffffff9c8;
  SpatialVector *in_stack_fffffffffffffa50;
  SpatialTransform *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  uint uVar13;
  SpatialVector *in_stack_fffffffffffffab0;
  SpatialRigidBodyInertia *in_stack_fffffffffffffab8;
  uint local_3dc;
  uint local_27c;
  uint local_64;
  SpatialTransform local_60;
  
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = (double)in_R9;
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = (double)in_R8;
  local_60.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = (double)in_RDI;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff890);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)local_60.r.super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[2] + 0x78))->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = -*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = -*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = -*pSVar2;
  this = &local_60;
  SpatialVector_t::set
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900,
             in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
             in_stack_fffffffffffff920);
  for (local_64 = 1;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)local_60.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 0x330))->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish), local_64 < sVar3; local_64 = local_64 + 1
      ) {
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((long)local_60.r.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2] + 0x90))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2],(ulong)local_64);
    uVar13 = *pvVar4;
    jcalc(in_stack_00000648,in_stack_00000644,in_stack_00000638,in_stack_00000630);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)((long)local_60.r.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2] + 0x2e8),(ulong)local_64);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
    Math::SpatialTransform::apply(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0xd8))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
              (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffff890,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)this);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0xf0))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x60))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0xd8))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    Math::crossm(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
              (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x1e0))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffff890,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)this);
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)local_60.r.super_Vector3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] + 0x90))->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
    if (pvVar5->mJointType == JointTypeCustom) {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_60.r.super_Vector3d.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 0x90))->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
      if (pvVar5->mJointType == JointTypeCustom) {
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   ((long)local_60.r.super_Vector3d.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2] + 0x90))->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_64)
        ;
        uVar1 = pvVar5->custom_joint_index;
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0x1c8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
                   (uint *)in_stack_fffffffffffff898);
        for (local_27c = 0;
            ppCVar6 = std::
                      vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                    *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        ((long)local_60.r.super_Vector3d.
                                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                               .m_storage.m_data.array[2] + 0x1c8))->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)uVar1), local_27c < *(uint *)(*ppCVar6 + 8);
            local_27c = local_27c + 1) {
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_fffffffffffff890,(Index)this);
          dVar12 = *pdVar7;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              in_stack_fffffffffffff890,(Index)this);
          *pSVar8 = dVar12;
        }
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)((long)local_60.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 0x2e8),(ulong)local_64);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        Math::SpatialTransform::apply(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x1e0))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0x1c8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffff890,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
        ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                     *)in_stack_fffffffffffff8b8,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                     *)in_stack_fffffffffffff8b0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff890,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                    *)this);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x817865)
        ;
      }
    }
    else {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_60.r.super_Vector3d.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 0x90))->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
      if (pvVar5->mDoFCount == 1) {
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)((long)local_60.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 0x2e8),(ulong)local_64);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        Math::SpatialTransform::apply(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x1e0))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0xa8))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                   in_stack_fffffffffffff890,(Index)this);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  (in_stack_fffffffffffff8d8,(double *)in_stack_fffffffffffff8d0);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
        ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                     *)in_stack_fffffffffffff8b8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_fffffffffffff8b0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x78))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff890,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)this);
      }
      else {
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   ((long)local_60.r.super_Vector3d.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2] + 0x90))->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_64)
        ;
        if (pvVar5->mDoFCount == 3) {
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0x2e8),(ulong)local_64);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)local_60.r.super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2] + 0x78))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
          Math::SpatialTransform::apply(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)local_60.r.super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2] + 0x1e0))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                    (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          in_stack_fffffffffffff958 =
               (SpatialTransform *)
               std::
               vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                             *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_60.r.super_Vector3d.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 0x150))->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                     in_stack_fffffffffffff890,(Index)this);
          in_stack_fffffffffffff950 =
               (SpatialTransform *)
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          in_stack_fffffffffffff890,(Index)this);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                     in_stack_fffffffffffff890,(Index)this);
          Vector3_t::Vector3_t
                    (in_stack_fffffffffffff8e0,(double *)in_stack_fffffffffffff8d8,
                     (double *)in_stack_fffffffffffff8d0,(double *)in_stack_fffffffffffff8c8);
          Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff890,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
          ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                       *)in_stack_fffffffffffff8b8,
                      (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                       *)in_stack_fffffffffffff8b0);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)local_60.r.super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2] + 0x78))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
          SpatialVector_t::operator=
                    ((SpatialVector_t *)in_stack_fffffffffffff890,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)this);
        }
      }
    }
    pvVar9 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)local_60.r.super_Vector3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] + 0x330))->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish,(ulong)local_64);
    if ((pvVar9->mIsVirtual & 1U) == 0) {
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x288),(ulong)local_64);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] + 0x78))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] + 0x60))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x288),(ulong)local_64);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] + 0x60))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ulong)local_64);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      Math::crossf(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x270),(ulong)local_64);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffff890,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)this);
    }
    else {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x270),(ulong)local_64);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff890);
    }
  }
  if ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
      local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] !=
      (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)0x0) {
    local_3dc = 1;
    while( true ) {
      uVar10 = (ulong)local_3dc;
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)local_60.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 0x330))->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
      if (sVar3 <= uVar10) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],(ulong)local_3dc);
      uVar13 = *pvVar4;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x2e8),(ulong)local_3dc);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x300),(ulong)uVar13);
      Math::SpatialTransform::operator*(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x300),(ulong)local_3dc);
      Math::SpatialTransform::operator=(in_stack_fffffffffffff890,this);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)((long)local_60.r.super_Vector3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2] + 0x300),(ulong)local_3dc);
      Math::SpatialTransform::toMatrixAdjoint
                ((SpatialTransform *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 local_60.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [6],(ulong)local_3dc);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_fffffffffffff890,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x270),(ulong)local_3dc);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_3dc = local_3dc + 1;
    }
  }
  sVar3 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    ((long)local_60.r.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2] + 0x330))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
  uVar13 = (uint)sVar3;
  while (uVar13 = uVar13 - 1, uVar13 != 0) {
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)local_60.r.super_Vector3d.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2] + 0x90))->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
    if (pvVar5->mJointType == JointTypeCustom) {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_60.r.super_Vector3d.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 0x90))->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
      if (pvVar5->mJointType == JointTypeCustom) {
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   ((long)local_60.r.super_Vector3d.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2] + 0x90))->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        uVar1 = pvVar5->custom_joint_index;
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0x1c8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   ((long)local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] + 0x270),(ulong)uVar13);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                   in_stack_fffffffffffff890,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
        in_stack_fffffffffffff8b0 =
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[7];
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   ((long)local_60.r.super_Vector3d.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2] + 0x90))->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        in_stack_fffffffffffff8b8 =
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(ulong)pvVar5->q_index;
        std::
        vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
        ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0x1c8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
        Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_int,int>
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8d0,
                   (Index)in_stack_fffffffffffff8c8,(Index)in_stack_fffffffffffff8c0,
                   (uint)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8);
        Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
                   in_stack_fffffffffffff890,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)this);
      }
    }
    else {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_60.r.super_Vector3d.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 0x90))->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
      if (pvVar5->mDoFCount == 1) {
        in_stack_fffffffffffff8c8 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)local_60.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] + 0xa8))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   ((long)local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2] + 0x270),(ulong)uVar13);
        RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
                 dot<Eigen::Matrix<double,6,1,0,6,1>>
                           ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                            in_stack_fffffffffffff890,
                            (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
        in_stack_fffffffffffff8d0 =
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             local_60.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[7];
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)local_60.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 0x90))->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffff890,(Index)this);
        *pSVar8 = RVar11;
      }
      else {
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   ((long)local_60.r.super_Vector3d.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2] + 0x90))->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
        if (pvVar5->mDoFCount == 3) {
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            ((long)local_60.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] + 0x150))->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
          Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)this);
          std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                    ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                     ((long)local_60.r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2] + 0x270),(ulong)uVar13);
          Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                     in_stack_fffffffffffff890,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this);
          in_stack_fffffffffffff8c0 =
               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               local_60.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [7];
          std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)&(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            ((long)local_60.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] + 0x90))->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)uVar13);
          Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
                    (in_stack_fffffffffffff8a0,(Index)in_stack_fffffffffffff898,
                     (Index)in_stack_fffffffffffff890);
          Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
                    ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)
                     in_stack_fffffffffffff890,
                     (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)this);
        }
      }
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2],(ulong)uVar13);
    if (*pvVar4 != 0) {
      in_stack_fffffffffffff890 =
           (SpatialTransform *)
           ((long)local_60.r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2] + 0x270);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],(ulong)uVar13);
      in_stack_fffffffffffff8a0 =
           (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      in_stack_fffffffffffff890,(ulong)*pvVar4);
      in_stack_fffffffffffff898 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)((long)local_60.r.super_Vector3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2] + 0x2e8),(ulong)uVar13);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 ((long)local_60.r.super_Vector3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 0x270),(ulong)uVar13);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      this_00 = (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                ((long)local_60.r.super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2] + 0x270);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          local_60.r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],(ulong)uVar13);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                (this_00,(ulong)*pvVar4);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffff890,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)this);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void InverseDynamics (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &QDDot,
    VectorNd &Tau,
    std::vector<SpatialVector> *f_ext) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].set (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    jcalc (model, i, Q, QDot);

    model.v[i] = model.X_lambda[i].apply(model.v[lambda]) + model.v_J[i];
    model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);

    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
          + model.c[i]
          + model.S[i] * QDDot[q_index];
      } else if (model.mJoints[i].mDoFCount == 3) {
        model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
          + model.c[i]
          + model.multdof3_S[i] * Vector3d (QDDot[q_index],
              QDDot[q_index + 1],
              QDDot[q_index + 2]);
      }
    }else if(model.mJoints[i].mJointType == JointTypeCustom){
      unsigned int k = model.mJoints[i].custom_joint_index;
      VectorNd customJointQDDot(model.mCustomJoints[k]->mDoFCount);
      for(unsigned z = 0; z < model.mCustomJoints[k]->mDoFCount; ++z){
        customJointQDDot[z] = QDDot[q_index+z];
      }
      model.a[i] =  model.X_lambda[i].apply(model.a[lambda])
        + model.c[i]
        + model.mCustomJoints[k]->S * customJointQDDot;
    }

    if (!model.mBodies[i].mIsVirtual) {
      model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
    } else {
      model.f[i].setZero();
    }
  }

  if (f_ext != NULL) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      unsigned int lambda = model.lambda[i];
      model.X_base[i] = model.X_lambda[i] * model.X_base[lambda];
      model.f[i] -= model.X_base[i].toMatrixAdjoint() * (*f_ext)[i];
    }
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        Tau[model.mJoints[i].q_index] = model.S[i].dot(model.f[i]);
      } else if (model.mJoints[i].mDoFCount == 3) {
        Tau.block<3,1>(model.mJoints[i].q_index, 0)
          = model.multdof3_S[i].transpose() * model.f[i];
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {  
      unsigned int k = model.mJoints[i].custom_joint_index;
      Tau.block(model.mJoints[i].q_index,0,
          model.mCustomJoints[k]->mDoFCount, 1)
        = model.mCustomJoints[k]->S.transpose() * model.f[i];
    }

    if (model.lambda[i] != 0) {
      model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
    }
  }
}